

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ctl.c
# Opt level: O0

char * get_gost_engine_param(int param)

{
  char *pcVar1;
  int in_EDI;
  char *tmp;
  char *local_8;
  
  if ((in_EDI < 0) || (2 < in_EDI)) {
    local_8 = (char *)0x0;
  }
  else if (gost_params[in_EDI] == (char *)0x0) {
    pcVar1 = getenv(gost_envnames[in_EDI]);
    if (pcVar1 == (char *)0x0) {
      local_8 = (char *)0x0;
    }
    else {
      CRYPTO_free(gost_params[in_EDI]);
      pcVar1 = CRYPTO_strdup(pcVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ctl.c"
                             ,0x36);
      gost_params[in_EDI] = pcVar1;
      local_8 = gost_params[in_EDI];
    }
  }
  else {
    local_8 = gost_params[in_EDI];
  }
  return local_8;
}

Assistant:

const char *get_gost_engine_param(int param)
{
    char *tmp;
    if (param < 0 || param >= GOST_PARAM_MAX)
        return NULL;
    if (gost_params[param] != NULL) {
        return gost_params[param];
    }
    tmp = getenv(gost_envnames[param]);
    if (tmp) {
        OPENSSL_free(gost_params[param]);
        gost_params[param] = BUF_strdup(tmp);
        return gost_params[param];
    }
    return NULL;
}